

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O1

string * __thiscall
jbcoin::STLedgerEntry::getFullText_abi_cxx11_(string *__return_storage_ptr__,STLedgerEntry *this)

{
  Item *pIVar1;
  int in_ECX;
  string local_48;
  
  LedgerFormats::getInstance();
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::findByType
                     (&LedgerFormats::getInstance::instance.
                       super_KnownFormats<jbcoin::LedgerEntryType>,this->type_);
  if (pIVar1 != (Item *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
    strHex<unsigned_char_const*>(&local_48,(jbcoin *)&this->key_,&DAT_00000020,in_ECX);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(pIVar1->m_name)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    STObject::getFullText_abi_cxx11_(&local_48,&this->super_STObject);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  Throw<std::runtime_error,char_const(&)[26]>((char (*) [26])"invalid ledger entry type");
}

Assistant:

std::string STLedgerEntry::getFullText () const
{
    auto const format =
        LedgerFormats::getInstance().findByType (type_);

    if (format == nullptr)
        Throw<std::runtime_error> ("invalid ledger entry type");

    std::string ret = "\"";
    ret += to_string (key_);
    ret += "\" = { ";
    ret += format->getName ();
    ret += ", ";
    ret += STObject::getFullText ();
    ret += "}";
    return ret;
}